

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::ProfiledNewScFltArray
              (AuxArray<double> *doubles,ScriptContext *scriptContext,ArrayCallSiteInfo *arrayInfo,
              RecyclerWeakReference<Js::FunctionBody> *weakFuncRef)

{
  AuxArray<double> value;
  bool bVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  Var pvVar7;
  SparseArraySegmentBase *pSVar8;
  SparseArraySegmentBase *address;
  ulong uVar9;
  SparseArraySegmentBase *addr;
  ulong uVar10;
  JavascriptNativeArray *local_50;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  if ((((arrayInfo->field_0).bits & 2) != 0) ||
     (bVar4 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase), bVar4)) {
    uVar5 = doubles->count;
    uVar9 = (ulong)uVar5;
    local_50 = (JavascriptNativeArray *)
               JavascriptLibrary::CreateArrayLiteral
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary,uVar5);
    pSVar8 = (local_50->super_JavascriptArray).head.ptr;
    if ((uVar9 == 0) || (uVar5 != pSVar8->length)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x43e,"(count > 0 && count == head->length)",
                                  "count > 0 && count == head->length");
      if (!bVar4) {
LAB_00b6caf4:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
      if (uVar9 == 0) goto LAB_00b6cad8;
    }
    pSVar8 = pSVar8 + 1;
    uVar10 = 0;
    addr = pSVar8;
    do {
      value = doubles[uVar10 + 1];
      if ((((double)value != (double)(int)(double)value) ||
          (NAN((double)value) || NAN((double)(int)(double)value))) ||
         (bVar4 = NumberUtilities::IsSpecial((double)value,0x8000000000000000), bVar4)) {
        pvVar7 = JavascriptNumber::ToVarNoCheck((double)value,scriptContext);
        Memory::Recycler::WBSetBit((char *)addr);
        *(Var *)addr = pvVar7;
        address = (SparseArraySegmentBase *)(&pSVar8->left + uVar10 * 2);
      }
      else {
        Memory::Recycler::WBSetBit((char *)addr);
        addr->left = (int)((ulong)(uint)(int)(double)value | 0x1000000000000);
        addr->length = (int)(((ulong)(uint)(int)(double)value | 0x1000000000000) >> 0x20);
        address = addr;
      }
      Memory::RecyclerWriteBarrierManager::WriteBarrier(address);
      uVar10 = uVar10 + 1;
      addr = (SparseArraySegmentBase *)&addr->size;
    } while (uVar9 != uVar10);
  }
  else {
    ArrayCallSiteInfo::SetIsNotNativeIntArray(arrayInfo);
    uVar5 = doubles->count;
    uVar9 = (ulong)uVar5;
    local_50 = &JavascriptLibrary::CreateNativeFloatArrayLiteral
                          ((scriptContext->super_ScriptContextBase).javascriptLibrary,uVar5)->
                super_JavascriptNativeArray;
    pSVar8 = (local_50->super_JavascriptArray).head.ptr;
    if ((uVar5 == 0) || (uVar5 != pSVar8->length)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x434,"(count > 0 && count == head->length)",
                                  "count > 0 && count == head->length");
      if (!bVar4) goto LAB_00b6caf4;
      *puVar6 = 0;
      uVar5 = pSVar8->length;
    }
    Memory::CopyArray<double,double,Memory::Recycler>
              ((double *)(pSVar8 + 1),(ulong)uVar5,(double *)(doubles + 1),uVar9);
    JavascriptNativeArray::SetArrayProfileInfo(local_50,weakFuncRef,arrayInfo);
  }
LAB_00b6cad8:
  pTVar2->noJsReentrancy = bVar1;
  return local_50;
}

Assistant:

Var JavascriptArray::ProfiledNewScFltArray(AuxArray<double> *doubles, ScriptContext* scriptContext, ArrayCallSiteInfo *arrayInfo, RecyclerWeakReference<FunctionBody> *weakFuncRef)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrArr_ProfiledNewScFltArray, reentrancylock, scriptContext->GetThreadContext());
        // Called only to create array literals: size is known.
        if (arrayInfo->IsNativeFloatArray())
        {
            arrayInfo->SetIsNotNativeIntArray();
            uint32 count = doubles->count;
            JavascriptNativeFloatArray *arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(count);
            SparseArraySegment<double> *head = SparseArraySegment<double>::From(arr->head);
            Assert(count > 0 && count == head->length);
            CopyArray(head->elements, head->length, doubles->elements, count);
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);

            return arr;
        }

        uint32 count = doubles->count;
        JavascriptArray *arr = scriptContext->GetLibrary()->CreateArrayLiteral(count);
        SparseArraySegment<Var> *head = SparseArraySegment<Var>::From(arr->head);
        Assert(count > 0 && count == head->length);

        for (uint i = 0; i < count; i++)
        {
            double dval = doubles->elements[i];
            int32 ival;
            if (JavascriptNumber::TryGetInt32Value(dval, &ival) && !TaggedInt::IsOverflow(ival))
            {
                head->elements[i] = TaggedInt::ToVarUnchecked(ival);
            }
            else
            {
                head->elements[i] = JavascriptNumber::ToVarNoCheck(dval, scriptContext);
            }
        }

        return arr;
        JIT_HELPER_END(ScrArr_ProfiledNewScFltArray);
    }